

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O2

void __thiscall
cinatra::coro_http_response::to_buffers
          (coro_http_response *this,
          vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *buffers,string *size_str)

{
  long lVar1;
  size_type sVar2;
  string_view sVar3;
  const_buffer local_28;
  
  sVar3 = to_http_status_string(this->status_);
  local_28.data_ = sVar3._M_str;
  local_28.size_ = sVar3._M_len;
  if (local_28.size_ == 0) {
    local_28.data_ = (char *)0x0;
  }
  std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::
  emplace_back<asio::const_buffer>(buffers,&local_28);
  build_resp_head(this,buffers);
  sVar2 = (this->content_)._M_string_length;
  if (sVar2 == 0) {
    sVar2 = (this->content_view_)._M_len;
    lVar1 = 0xf8;
    if (sVar2 == 0) {
      return;
    }
  }
  else {
    lVar1 = 8;
  }
  sVar3._M_str = *(char **)(this->buf_ + lVar1 + -0x2b);
  sVar3._M_len = sVar2;
  handle_content(this,buffers,size_str,sVar3);
  return;
}

Assistant:

void to_buffers(std::vector<asio::const_buffer> &buffers,
                  std::string &size_str) {
    buffers.push_back(asio::buffer(to_http_status_string(status_)));
    build_resp_head(buffers);
    if (!content_.empty()) {
      handle_content(buffers, size_str, content_);
    }
    else if (!content_view_.empty()) {
      handle_content(buffers, size_str, content_view_);
    }
  }